

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_info.c
# Opt level: O2

MPP_RET hal_info_init(HalInfo *ctx,MppCtxType type,MppCodingType coding)

{
  MppCtxType MVar1;
  MppCtxType *pMVar2;
  MPP_RET MVar3;
  
  if (ctx == (HalInfo *)0x0) {
    _mpp_log_l(2,(char *)0x0,"found NULL input ctx\n","hal_info_init");
    MVar3 = MPP_ERR_NULL_PTR;
  }
  else {
    MVar1 = 0x16;
    if (type == MPP_CTX_DEC) {
      MVar1 = 0xb;
    }
    pMVar2 = (MppCtxType *)mpp_osal_calloc("hal_info_init",(ulong)(MVar1 * 0x10 + 0x18));
    if (pMVar2 == (MppCtxType *)0x0) {
      MVar3 = MPP_NOK;
    }
    else {
      *pMVar2 = type;
      pMVar2[1] = coding;
      pMVar2[3] = MVar1;
      *(MppCtxType **)(pMVar2 + 4) = pMVar2 + 6;
      MVar3 = MPP_OK;
    }
    *ctx = pMVar2;
  }
  return MVar3;
}

Assistant:

MPP_RET hal_info_init(HalInfo *ctx, MppCtxType type, MppCodingType coding)
{
    if (NULL == ctx) {
        mpp_err_f("found NULL input ctx\n");
        return MPP_ERR_NULL_PTR;
    }

    MPP_RET ret = MPP_NOK;
    RK_U32 elem_nb = (type == MPP_CTX_DEC) ? (ENC_INFO_BUTT) : (DEC_INFO_BUTT);
    HalInfoImpl *impl = mpp_calloc_size(HalInfoImpl, sizeof(HalInfoImpl) +
                                        sizeof(MppDevInfoCfg) * elem_nb);
    if (impl) {
        impl->type = type;
        impl->coding = coding;
        impl->elem_nb = elem_nb;
        impl->elems = (MppDevInfoCfg *)(impl + 1);
        ret = MPP_OK;
    }

    *ctx = impl;

    return ret;
}